

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O1

void __thiscall
GraphContigger::pop_all_error_bubbles
          (GraphContigger *this,GraphEditor *ge,PairedReadsDatastore *peds,int size,bool apply)

{
  ulong uVar1;
  bool bVar2;
  uint64_t uVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  pointer this_00;
  GraphContigger *this_01;
  int iVar7;
  int iVar8;
  bool bVar9;
  NodeView *local_78 [2];
  long local_68;
  vector<NodeView,_std::allocator<NodeView>_> local_60;
  vector<NodeView,_std::allocator<NodeView>_> local_48;
  
  iVar7 = 0;
  DistanceGraph::get_all_nodeviews(&local_60,*(DistanceGraph **)this,false,true);
  iVar8 = 0;
  if (local_60.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar8 = 0;
    iVar7 = 0;
    this_00 = local_60.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar3 = NodeView::size(this_00);
      if ((ulong)(long)size < uVar3) {
LAB_001eb8d7:
        bVar2 = false;
        bVar9 = false;
      }
      else {
        bVar2 = NodeView::is_bubble_side(this_00);
        if (!bVar2) goto LAB_001eb8d7;
        uVar1 = this_00->id;
        NodeView::parallels(&local_48,this_00);
        uVar4 = -uVar1;
        if (0 < (long)uVar1) {
          uVar4 = uVar1;
        }
        uVar1 = (local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                 super__Vector_impl_data._M_start)->id;
        uVar6 = -uVar1;
        if (0 < (long)uVar1) {
          uVar6 = uVar1;
        }
        bVar9 = uVar4 < uVar6;
        bVar2 = true;
      }
      if ((bVar2) &&
         (local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (bVar9) {
        this_01 = (GraphContigger *)local_78;
        NodeView::parallels((vector<NodeView,_std::allocator<NodeView>_> *)this_01,this_00);
        bVar2 = pop_error_bubbble(this_01,ge,this_00,local_78[0],peds,5,10,10,false);
        if (local_78[0] != (NodeView *)0x0) {
          operator_delete(local_78[0],local_68 - (long)local_78[0]);
        }
        iVar8 = iVar8 + 1;
        iVar7 = iVar7 + (uint)bVar2;
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             local_60.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_60.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start != (NodeView *)0x0) {
    operator_delete(local_60.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," canonical repeats solved!",0x1a);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (apply) {
    GraphEditor::apply_all(ge);
    SequenceDistanceGraph::join_all_unitigs(*(SequenceDistanceGraph **)this);
  }
  return;
}

Assistant:

void GraphContigger::pop_all_error_bubbles(GraphEditor &ge, PairedReadsDatastore &peds, int size, bool apply){
    int total=0;
    int solved=0;
    for (auto &nv: ws.sdg.get_all_nodeviews()){
        if (nv.size()<=size and nv.is_bubble_side() and std::abs(nv.node_id())<std::abs(nv.parallels()[0].node_id())) {
            total++;
            if (pop_error_bubbble(ge, nv, nv.parallels()[0], peds)){
                solved++;
            }
        }
    }
    std::cout << solved << "/" << total << " canonical repeats solved!" << std::endl;
    if (apply) {
        ge.apply_all();
        ws.sdg.join_all_unitigs();
    }
}